

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O3

int g80_physpages_from_pt(uint64_t pt,int hostmem,uint64_t *phys_pages)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = (uint)(pt >> 0x10) & 0xffffff;
  uVar3 = uVar5 + 0x2000000;
  if (hostmem == 0) {
    uVar3 = uVar5;
  }
  pvVar1 = (*nva_cards)->bar0;
  *(uint *)((long)pvVar1 + 0x1700) = uVar3;
  lVar4 = 0;
  iVar2 = 0;
  do {
    uVar3 = *(uint *)((long)pvVar1 + lVar4 * 8 + (pt & 0xffff) + 0x700000);
    if ((char)uVar3 == '1' && 0xfff < uVar3) {
      lVar6 = (long)iVar2;
      iVar2 = iVar2 + 1;
      phys_pages[lVar6] = (ulong)(uVar3 & 0xfffff000);
    }
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 0x400);
  return iVar2;
}

Assistant:

int g80_physpages_from_pt(uint64_t pt, int hostmem, uint64_t *phys_pages)
{
	uint32_t lo, hi;
	int i;
	uint32_t tmp;
	int entries = 0;

	hi = (pt & 0xffffff0000ull) >> 16;
	if (hostmem)
		hi |= 0x2000000;

	lo = (pt & 0xffff);

	// Lets go and read this pt
	poke(0x1700, hi);
	for (i = 0; i < 1024; i++, lo += 8) {
		tmp = peek(0x700000 + lo);
		if ((tmp & 0x000000ff) != 0x31) {
			continue;
		}
		if (tmp & 0xfffff000)
			phys_pages[entries++] = tmp & 0xfffff000ull;

	}

	return entries;
}